

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

bool tinyusdz::is_close(matrix2d *a,matrix2d *b,double eps)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = a->m[0][0];
  dVar1 = b->m[0][0];
  dVar4 = ABS(dVar3 - dVar1);
  if (dVar4 <= eps) {
LAB_002771ee:
    dVar3 = a->m[0][1];
    dVar1 = b->m[0][1];
    dVar4 = ABS(dVar3 - dVar1);
    if (eps < dVar4) {
      dVar3 = fmax(ABS(dVar3),ABS(dVar1));
      if (dVar3 * eps < dVar4) goto LAB_0027728a;
    }
    dVar3 = a->m[1][0];
    dVar1 = b->m[1][0];
    dVar4 = ABS(dVar3 - dVar1);
    if (eps < dVar4) {
      dVar3 = fmax(ABS(dVar3),ABS(dVar1));
      if (dVar3 * eps < dVar4) goto LAB_0027728a;
    }
    dVar3 = a->m[1][1];
    dVar1 = b->m[1][1];
    dVar4 = ABS(dVar3 - dVar1);
    bVar2 = true;
    if (eps < dVar4) {
      dVar3 = fmax(ABS(dVar3),ABS(dVar1));
      bVar2 = dVar4 <= dVar3 * eps;
    }
  }
  else {
    dVar3 = fmax(ABS(dVar3),ABS(dVar1));
    if (dVar4 <= dVar3 * eps) goto LAB_002771ee;
LAB_0027728a:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool is_close(const value::matrix2d &a, const value::matrix2d &b, const double eps) {
  return math::is_close(a.m[0][0], b.m[0][0], eps) &&
         math::is_close(a.m[0][1], b.m[0][1], eps) &&
         math::is_close(a.m[1][0], b.m[1][0], eps) &&
         math::is_close(a.m[1][1], b.m[1][1], eps);
}